

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall Parser::match(Parser *this,token t)

{
  DatalogProgram *this_00;
  pointer pcVar1;
  token tVar2;
  runtime_error *this_01;
  tok *ptVar3;
  string local_48;
  
  if ((this->curr).t != t) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Tokens don\'t match.");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (t == STRING) {
    this_00 = this->prog;
    pcVar1 = (this->curr).s._M_dataplus._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + (this->curr).s._M_string_length);
    DatalogProgram::add_dom_str(this_00,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    ptVar3 = (this->it)._M_current + 1;
    (this->it)._M_current = ptVar3;
  }
  else {
    ptVar3 = (this->it)._M_current + 1;
    (this->it)._M_current = ptVar3;
    if (t == END_FILE) {
      return;
    }
  }
  if (ptVar3 != (this->toks).super__Vector_base<tok,_std::allocator<tok>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    tVar2 = ptVar3->t;
    (this->curr).line = ptVar3->line;
    (this->curr).t = tVar2;
    std::__cxx11::string::_M_assign((string *)&(this->curr).s);
  }
  return;
}

Assistant:

void Parser::match(token t)
{
//	print_tok(curr,cout);
//	cout << s->tok_string(t) << endl;
	if (t != curr.t) throw runtime_error("Tokens don't match.");
	if (t == STRING) prog->add_dom_str(curr.s);
	it++;
	if (t==END_FILE || it == toks.end()) return;
	curr = *it;
}